

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjCompressFromYUV(tjhandle handle,uchar *srcBuf,int width,int pad,int height,int subsamp,
                     uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  tjinstance *this;
  long in_FS_OFFSET;
  uchar *srcPlanes [3];
  int strides [3];
  uchar *local_58;
  uchar *local_50;
  uchar *puStack_48;
  undefined8 local_38;
  
  if (handle != (tjhandle)0x0) {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    if (((height < 1 || srcBuf == (uchar *)0x0) || (pad < 1 || width < 1)) || 5 < (uint)subsamp) {
      builtin_strncpy((char *)((long)handle + 0x618),"V(): Inv",8);
      builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjCompre",8);
      builtin_strncpy((char *)((long)handle + 0x610),"ssFromYU",8);
      *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      *(undefined8 *)(in_FS_OFFSET + -0xb2) = 0x746e656d756772;
      builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"V(): Inv",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"alid arg",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjCompre",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -200),"ssFromYU",8);
      iVar1 = -1;
    }
    else {
      iVar1 = tjMCUWidth[(uint)subsamp];
      iVar2 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = tjMCUHeight[(uint)subsamp];
      strides[0] = ((-(iVar2 >> 3) & (width + (iVar2 >> 3)) - 1U) + pad) - 1 & -pad;
      local_58 = srcBuf;
      if (subsamp == 3) {
        strides[1] = 0;
        strides[2] = 0;
        local_50 = (uchar *)0x0;
        puStack_48 = (uchar *)0x0;
      }
      else {
        iVar2 = iVar1 + 7;
        if (-1 < iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = tjPlaneWidth(1,width,subsamp);
        local_38 = CONCAT44(extraout_var,iVar1);
        iVar1 = tjPlaneHeight(1,height,subsamp);
        strides[2] = ((int)local_38 + pad) - 1U & -pad;
        strides[1] = strides[2];
        local_50 = local_58 +
                   (long)(int)(-(iVar2 >> 3) & (height + (iVar2 >> 3)) - 1U) * (long)strides[0];
        puStack_48 = local_50 + strides[2] * iVar1;
      }
      iVar1 = tjCompressFromYUVPlanes
                        (handle,&local_58,width,strides,height,subsamp,jpegBuf,jpegSize,jpegQual,
                         (int)srcPlanes[0]);
    }
    return iVar1;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"V(): Inv",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"alid han",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjCompre",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"ssFromYU",8);
  *(undefined4 *)(in_FS_OFFSET + -0xb0) = 0x656c64;
  return -1;
}

Assistant:

DLLEXPORT int tjCompressFromYUV(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pad, int height, int subsamp,
                                unsigned char **jpegBuf,
                                unsigned long *jpegSize, int jpegQual,
                                int flags)
{
  const unsigned char *srcPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjCompressFromYUV(): Invalid handle");
  this->isInstanceError = FALSE;

  if (srcBuf == NULL || width <= 0 || pad < 1 || height <= 0 || subsamp < 0 ||
      subsamp >= NUMSUBOPT)
    THROW("tjCompressFromYUV(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  srcPlanes[0] = srcBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    srcPlanes[1] = srcPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    srcPlanes[1] = srcPlanes[0] + strides[0] * ph0;
    srcPlanes[2] = srcPlanes[1] + strides[1] * ph1;
  }

  return tjCompressFromYUVPlanes(handle, srcPlanes, width, strides, height,
                                 subsamp, jpegBuf, jpegSize, jpegQual, flags);

bailout:
  return retval;
}